

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void initialize_impute_calc<ImputedData<unsigned_long,long_double>,InputData<double,unsigned_long>>
               (ImputedData<unsigned_long,_long_double> *imp,
               InputData<double,_unsigned_long> *input_data,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  double *pdVar1;
  pointer puVar2;
  size_t sVar3;
  int *piVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  size_t col;
  ulong uVar7;
  size_t cat;
  size_type __n;
  vector<long_double,_std::allocator<long_double>_> *this_00;
  value_type_conflict3 local_48;
  unsigned_long local_38;
  
  imp->n_missing_sp = 0;
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  local_38 = row;
  if (input_data->numeric_data == (double *)0x0) {
    if (input_data->Xc_indptr == (unsigned_long *)0x0) goto LAB_00211d23;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&imp->missing_sp,input_data->ncols_numeric);
    for (uVar7 = 0; uVar7 < input_data->ncols_numeric; uVar7 = uVar7 + 1) {
      puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (input_data->Xc_ind + input_data->Xc_indptr[uVar7],
                          input_data->Xc_ind + input_data->Xc_indptr[uVar7 + 1],&local_38);
      if (((puVar6 != input_data->Xc_ind + input_data->Xc_indptr[uVar7 + 1]) &&
          (*puVar6 == local_38)) &&
         (0x7fefffffffffffff <
          (*(ulong *)((long)input_data->Xc + ((long)puVar6 - (long)input_data->Xc_ind)) &
          0x7fffffffffffffff))) {
        puVar2 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar3 = imp->n_missing_sp;
        imp->n_missing_sp = sVar3 + 1;
        puVar2[sVar3] = uVar7;
      }
    }
    local_48._0_10_ = (longdouble)0;
    std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
              (&imp->sp_num_sum,imp->n_missing_sp,&local_48);
    this_00 = &imp->sp_num_weight;
    __n = imp->n_missing_sp;
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&imp->missing_num,input_data->ncols_numeric);
    pdVar1 = input_data->numeric_data;
    puVar2 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar7 < input_data->ncols_numeric; uVar7 = uVar7 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS(pdVar1[row + input_data->nrows * uVar7])) {
        sVar3 = imp->n_missing_num;
        imp->n_missing_num = sVar3 + 1;
        puVar2[sVar3] = uVar7;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&imp->missing_num,imp->n_missing_num);
    local_48._0_10_ = (longdouble)0;
    std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
              (&imp->num_sum,imp->n_missing_num,&local_48);
    this_00 = &imp->num_weight;
    __n = imp->n_missing_num;
  }
  local_48._0_10_ = (longdouble)0;
  std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign(this_00,__n,&local_48);
LAB_00211d23:
  if (input_data->categ_data != (int *)0x0) {
    this = &imp->missing_cat;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this,input_data->ncols_categ)
    ;
    piVar4 = input_data->categ_data;
    puVar2 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar7 < input_data->ncols_categ; uVar7 = uVar7 + 1) {
      if (piVar4[local_38 + input_data->nrows * uVar7] < 0) {
        sVar3 = imp->n_missing_cat;
        imp->n_missing_cat = sVar3 + 1;
        puVar2[sVar3] = uVar7;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this,imp->n_missing_cat);
    local_48._0_10_ = (longdouble)0;
    std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
              (&imp->cat_weight,imp->n_missing_cat,&local_48);
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::resize(&imp->cat_sum,input_data->ncols_categ);
    for (uVar7 = 0; uVar7 < imp->n_missing_cat; uVar7 = uVar7 + 1) {
      uVar5 = (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      local_48._0_10_ = (longdouble)0;
      std::vector<long_double,_std::allocator<long_double>_>::_M_fill_assign
                ((imp->cat_sum).
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,(long)input_data->ncat[uVar5],
                 &local_48);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, InputData &input_data, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (input_data.numeric_data != NULL)
    {
        imp.missing_num.resize(input_data.ncols_numeric);
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                imp.missing_num[imp.n_missing_num++] = col;
        imp.missing_num.resize(imp.n_missing_num);
        imp.num_sum.assign(imp.n_missing_num,    0);
        imp.num_weight.assign(imp.n_missing_num, 0);
    }

    else if (input_data.Xc_indptr != NULL)
    {
        imp.missing_sp.resize(input_data.ncols_numeric);
        decltype(input_data.Xc_indptr) res;
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            res = std::lower_bound(input_data.Xc_ind + input_data.Xc_indptr[col],
                                   input_data.Xc_ind + input_data.Xc_indptr[col + 1],
                                   row);
            if (
                res != input_data.Xc_ind + input_data.Xc_indptr[col + 1] && 
                *res == static_cast<typename std::remove_pointer<decltype(res)>::type>(row) && 
                is_na_or_inf(input_data.Xc[res - input_data.Xc_ind])
                )
            {
                imp.missing_sp[imp.n_missing_sp++] = col;
            }
        }
        imp.sp_num_sum.assign(imp.n_missing_sp,    0);
        imp.sp_num_weight.assign(imp.n_missing_sp, 0);
    }
    
    if (input_data.categ_data != NULL)
    {
        imp.missing_cat.resize(input_data.ncols_categ);
        for (size_t col = 0; col < input_data.ncols_categ; col++)
            if (input_data.categ_data[row + col * input_data.nrows] < 0)
                imp.missing_cat[imp.n_missing_cat++] = col;
        imp.missing_cat.resize(imp.n_missing_cat);
        imp.cat_weight.assign(imp.n_missing_cat, 0);
        imp.cat_sum.resize(input_data.ncols_categ);
        for (size_t cat = 0; cat < imp.n_missing_cat; cat++)
            imp.cat_sum[imp.missing_cat[cat]].assign(input_data.ncat[imp.missing_cat[cat]], 0);
    }
}